

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  anon_class_16_2_455e6bc1 local_48;
  function<bool_()> local_38;
  EnumType local_14;
  Logger *pLStack_10;
  EnumType lIndex;
  Logger *this_local;
  
  pLStack_10 = this;
  el::base::utils::std::
  map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear(&this->m_unflushedCount);
  local_14 = 2;
  local_48.this = this;
  local_48.lIndex = &local_14;
  std::function<bool()>::function<el::Logger::initUnflushedCount()::__0,void>
            ((function<bool()> *)&local_38,&local_48);
  LevelHelper::forEachLevel(&local_14,&local_38);
  el::base::utils::std::function<bool_()>::~function(&local_38);
  return;
}

Assistant:

void Logger::initUnflushedCount(void) {
  m_unflushedCount.clear();
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
    return false;
  });
}